

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOAidFunction.cpp
# Opt level: O2

char * catStrIntStr(char *c1,int ss,char *c2)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  char tmp [100];
  
  sVar1 = strlen(c1);
  sVar2 = strlen(c2);
  uVar3 = (ulong)((int)sVar2 + (int)sVar1 + 10);
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)uVar3) {
    uVar5 = uVar3;
  }
  pcVar4 = (char *)operator_new__(uVar5);
  strcpy(pcVar4,c1);
  sprintf(tmp,"%d",ss);
  strcat(pcVar4,tmp);
  pcVar4 = strcat(pcVar4,c2);
  return pcVar4;
}

Assistant:

char *catStrIntStr(const char *c1, int ss,const char *c2){
    int len1 = strlen(c1), len2 = strlen(c2);
    char *str3;
    str3 = new char [len1+len2+10];
    strcpy(str3, c1);
    char tmp[100];
    sprintf(tmp, "%d", ss);
    strcat(str3, tmp);
    strcat(str3, c2);

    return str3;
}